

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureTests.cpp
# Opt level: O2

IterateResult __thiscall
gl4cts::SparseTextureAllocationTestCase::iterate(SparseTextureAllocationTestCase *this)

{
  ostringstream *poVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  ostream *poVar4;
  char *description;
  qpTestResult testResult;
  TestContext *this_00;
  GLint *format;
  int *piVar5;
  int *piVar6;
  allocator<char> local_1d0 [32];
  undefined1 local_1b0 [384];
  Functions *gl;
  
  bVar2 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_sparse_texture");
  if (bVar2) {
    iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    gl = (Functions *)CONCAT44(extraout_var,iVar3);
    for (piVar6 = (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        piVar6 != (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish; piVar6 = piVar6 + 1) {
      piVar5 = (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>.
               _M_impl.super__Vector_impl_data._M_start;
LAB_00acdf4f:
      if (piVar5 != (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_finish) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1b0,glcts::fixed_sample_locations_values + 1,local_1d0);
        std::__cxx11::stringbuf::str((string *)&this->field_0x90);
        std::__cxx11::string::~string((string *)local_1b0);
        poVar4 = std::operator<<((ostream *)&this->field_0x88,
                                 "Testing sparse texture allocation for target: ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,*piVar6);
        poVar4 = std::operator<<(poVar4,", format: ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,*piVar5);
        std::operator<<(poVar4," - ");
        bVar2 = positiveTesting(this,gl,*piVar6,*piVar5);
        if ((((bVar2) && (bVar2 = verifyTexParameterErrors(this,gl,*piVar6,*piVar5), bVar2)) &&
            (bVar2 = verifyTexStorageVirtualPageSizeIndexError(this,gl,*piVar6,*piVar5), bVar2)) &&
           (bVar2 = verifyTexStorageFullArrayCubeMipmapsError(this,gl,*piVar6,*piVar5), bVar2))
        goto code_r0x00ace025;
        goto LAB_00ace05e;
      }
    }
    for (piVar6 = (this->mFullArrayTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        piVar6 != (this->mFullArrayTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish; piVar6 = piVar6 + 1) {
      piVar5 = (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>.
               _M_impl.super__Vector_impl_data._M_start;
LAB_00ace10a:
      if (piVar5 != (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_finish) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1b0,glcts::fixed_sample_locations_values + 1,local_1d0);
        std::__cxx11::stringbuf::str((string *)&this->field_0x90);
        std::__cxx11::string::~string((string *)local_1b0);
        poVar4 = std::operator<<((ostream *)&this->field_0x88,
                                 "Testing sparse texture allocation for target [full array]: ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,*piVar6);
        poVar4 = std::operator<<(poVar4,", format: ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,*piVar5);
        std::operator<<(poVar4," - ");
        bVar2 = verifyTexStorageFullArrayCubeMipmapsError(this,gl,*piVar6,*piVar5);
        if (bVar2) goto code_r0x00ace19b;
        goto LAB_00ace1c5;
      }
    }
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Pass";
    testResult = QP_TEST_RESULT_PASS;
  }
  else {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
LAB_00ace0d1:
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
code_r0x00ace025:
  bVar2 = verifyTexStorageInvalidValueErrors(this,gl,*piVar6,*piVar5);
  piVar5 = piVar5 + 1;
  if (!bVar2) {
LAB_00ace05e:
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__cxx11::stringbuf::str();
    std::operator<<((ostream *)poVar1,(string *)local_1d0);
    std::operator<<((ostream *)poVar1,"Fail");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    goto LAB_00ace0b1;
  }
  goto LAB_00acdf4f;
code_r0x00ace19b:
  bVar2 = verifyTexStorageInvalidValueErrors(this,gl,*piVar6,*piVar5);
  piVar5 = piVar5 + 1;
  if (bVar2) goto LAB_00ace10a;
LAB_00ace1c5:
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__cxx11::stringbuf::str();
  std::operator<<((ostream *)poVar1,(string *)local_1d0);
  std::operator<<((ostream *)poVar1,"Fail");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_00ace0b1:
  std::__cxx11::string::~string((string *)local_1d0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
  this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
  description = "Fail";
  testResult = QP_TEST_RESULT_FAIL;
  goto LAB_00ace0d1;
}

Assistant:

tcu::TestNode::IterateResult SparseTextureAllocationTestCase::iterate()
{
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_sparse_texture"))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");
		return STOP;
	}

	const Functions& gl = m_context.getRenderContext().getFunctions();

	bool result = true;

	for (std::vector<glw::GLint>::const_iterator iter = mSupportedTargets.begin(); iter != mSupportedTargets.end();
		 ++iter)
	{
		const GLint& target = *iter;

		for (std::vector<glw::GLint>::const_iterator formIter = mSupportedInternalFormats.begin();
			 formIter != mSupportedInternalFormats.end(); ++formIter)
		{
			const GLint& format = *formIter;

			mLog.str("");
			mLog << "Testing sparse texture allocation for target: " << target << ", format: " << format << " - ";

			result = positiveTesting(gl, target, format) && verifyTexParameterErrors(gl, target, format) &&
					 verifyTexStorageVirtualPageSizeIndexError(gl, target, format) &&
					 verifyTexStorageFullArrayCubeMipmapsError(gl, target, format) &&
					 verifyTexStorageInvalidValueErrors(gl, target, format);

			if (!result)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << mLog.str() << "Fail" << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
				return STOP;
			}
		}
	}

	for (std::vector<glw::GLint>::const_iterator iter = mFullArrayTargets.begin(); iter != mFullArrayTargets.end();
		 ++iter)
	{
		const GLint& target = *iter;

		for (std::vector<glw::GLint>::const_iterator formIter = mSupportedInternalFormats.begin();
			 formIter != mSupportedInternalFormats.end(); ++formIter)
		{
			const GLint& format = *formIter;

			mLog.str("");
			mLog << "Testing sparse texture allocation for target [full array]: " << target << ", format: " << format
				 << " - ";

			result = verifyTexStorageFullArrayCubeMipmapsError(gl, target, format) &&
					 verifyTexStorageInvalidValueErrors(gl, target, format);

			if (!result)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << mLog.str() << "Fail" << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
				return STOP;
			}
		}
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}